

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubroutineSymbols.cpp
# Opt level: O1

void __thiscall
slang::ast::LocalVarCheckVisitor::visit<slang::ast::SimpleAssignmentPatternExpression>
          (LocalVarCheckVisitor *this,SimpleAssignmentPatternExpression *expr)

{
  ExpressionKind EVar1;
  size_t sVar2;
  pointer ppEVar3;
  Expression *this_00;
  variant_alternative_t<0UL,_variant<const_SubroutineSymbol_*,_SystemCallInfo>_> symbol;
  variant_alternative_t<0UL,_variant<const_SubroutineSymbol_*,_SystemCallInfo>_> *ppSVar4;
  SyntaxNode **ppSVar5;
  long lVar6;
  CallExpression *call;
  
  if (this->anyErrors != false) {
    return;
  }
  EVar1 = (expr->super_AssignmentPatternExpressionBase).super_Expression.kind;
  if ((EVar1 & ~IntegerLiteral) == NamedValue) {
    symbol = (variant_alternative_t<0UL,_variant<const_SubroutineSymbol_*,_SystemCallInfo>_>)
             Expression::getSymbolReference((Expression *)expr,true);
    if ((symbol == (variant_alternative_t<0UL,_variant<const_SubroutineSymbol_*,_SystemCallInfo>_>)
                   0x0) || ((symbol->super_Symbol).kind != ClassProperty)) goto LAB_002541e2;
    ppSVar5 = &symbol[1].super_Symbol.originatingSyntax;
  }
  else {
    if ((EVar1 != Call) ||
       (*(char *)&expr[1].super_AssignmentPatternExpressionBase.super_Expression.syntax == '\x01'))
    goto LAB_002541e2;
    ppSVar4 = std::
              get<0ul,slang::ast::SubroutineSymbol_const*,slang::ast::CallExpression::SystemCallInfo>
                        ((variant<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                          *)&(expr->super_AssignmentPatternExpressionBase).elements_);
    symbol = *ppSVar4;
    ppSVar5 = (SyntaxNode **)&symbol->visibility;
  }
  checkVisibility(this,&symbol->super_Symbol,(Expression *)expr,*(Visibility *)ppSVar5);
LAB_002541e2:
  sVar2 = (expr->super_AssignmentPatternExpressionBase).elements_._M_extent._M_extent_value;
  if (sVar2 != 0) {
    ppEVar3 = (expr->super_AssignmentPatternExpressionBase).elements_._M_ptr;
    lVar6 = 0;
    do {
      this_00 = *(Expression **)((long)ppEVar3 + lVar6);
      Expression::visitExpression<slang::ast::Expression_const,slang::ast::LocalVarCheckVisitor&>
                (this_00,this_00,this);
      lVar6 = lVar6 + 8;
    } while (sVar2 << 3 != lVar6);
  }
  return;
}

Assistant:

void visit(const T& expr) {
        if (anyErrors)
            return;

        if constexpr (std::is_base_of_v<Expression, T>) {
            if (ValueExpressionBase::isKind(expr.kind)) {
                if (auto sym = expr.getSymbolReference();
                    sym && sym->kind == SymbolKind::ClassProperty) {
                    checkVisibility(*sym, expr, sym->template as<ClassPropertySymbol>().visibility);
                }
            }
            else if (expr.kind == ExpressionKind::Call) {
                auto& call = expr.template as<CallExpression>();
                if (!call.isSystemCall()) {
                    auto& sub = *std::get<const SubroutineSymbol*>(call.subroutine);
                    checkVisibility(sub, expr, sub.visibility);
                }
            }

            if constexpr (HasVisitExprs<T, LocalVarCheckVisitor>) {
                expr.visitExprs(*this);
            }
        }
    }